

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O0

bool __thiscall Kumu::Timestamp::Unarchive(Timestamp *this,MemIOReader *Reader)

{
  bool bVar1;
  ui8_t local_28;
  ui8_t local_27;
  ui8_t local_26;
  ui8_t local_25;
  ui8_t local_24;
  ui8_t local_23;
  ui16_t local_22;
  ui8_t tick;
  ui8_t second;
  ui8_t minute;
  ui8_t hour;
  ui8_t day;
  ui8_t month;
  ui16_t year;
  MemIOReader *Reader_local;
  Timestamp *this_local;
  
  _tick = Reader;
  Reader_local = (MemIOReader *)this;
  if (Reader != (MemIOReader *)0x0) {
    bVar1 = MemIOReader::ReadUi16BE(Reader,&local_22);
    if (bVar1) {
      bVar1 = MemIOReader::ReadUi8(_tick,&local_23);
      if (bVar1) {
        bVar1 = MemIOReader::ReadUi8(_tick,&local_24);
        if (bVar1) {
          bVar1 = MemIOReader::ReadUi8(_tick,&local_25);
          if (bVar1) {
            bVar1 = MemIOReader::ReadUi8(_tick,&local_26);
            if (bVar1) {
              bVar1 = MemIOReader::ReadUi8(_tick,&local_27);
              if (bVar1) {
                bVar1 = MemIOReader::ReadUi8(_tick,&local_28);
                if (bVar1) {
                  SetComponents(this,&local_22,&local_23,&local_24,&local_25,&local_26,&local_27);
                  this_local._7_1_ = true;
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
    return this_local._7_1_;
  }
  __assert_fail("Reader",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.cpp"
                ,0x3dd,"virtual bool Kumu::Timestamp::Unarchive(MemIOReader *)");
}

Assistant:

bool
Kumu::Timestamp::Unarchive(MemIOReader* Reader)
{
  ui16_t year;
  ui8_t month, day, hour, minute, second, tick;

  assert(Reader);
  if ( ! Reader->ReadUi16BE(&year) ) return false;
  if ( ! Reader->ReadUi8(&month) ) return false;
  if ( ! Reader->ReadUi8(&day) ) return false;
  if ( ! Reader->ReadUi8(&hour) ) return false;
  if ( ! Reader->ReadUi8(&minute) ) return false;
  if ( ! Reader->ReadUi8(&second) ) return false;
  if ( ! Reader->ReadUi8(&tick) ) return false;
  SetComponents(year, month, day, hour, minute, second);
  return true;
}